

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Transform * phyr::Transform::translate(Vector3f *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Transform *in_RDI;
  
  dVar1 = v->x;
  dVar2 = v->y;
  dVar3 = v->z;
  (in_RDI->mat).d[0][0] = 1.0;
  (in_RDI->mat).d[0][1] = 0.0;
  (in_RDI->mat).d[0][2] = 0.0;
  (in_RDI->mat).d[0][3] = dVar1;
  *(undefined4 *)(in_RDI->mat).d[1] = 0;
  *(undefined4 *)((long)(in_RDI->mat).d[1] + 4) = 0;
  *(undefined4 *)((in_RDI->mat).d[1] + 1) = 0;
  *(undefined4 *)((long)(in_RDI->mat).d[1] + 0xc) = 0x3ff00000;
  (in_RDI->mat).d[1][2] = 0.0;
  (in_RDI->mat).d[1][3] = dVar2;
  (in_RDI->mat).d[2][0] = 0.0;
  (in_RDI->mat).d[2][1] = 0.0;
  (in_RDI->mat).d[2][2] = 1.0;
  (in_RDI->mat).d[2][3] = dVar3;
  (in_RDI->mat).d[3][0] = 0.0;
  (in_RDI->mat).d[3][1] = 0.0;
  (in_RDI->mat).d[3][2] = 0.0;
  (in_RDI->mat).d[3][3] = 1.0;
  (in_RDI->invMat).d[0][0] = 1.0;
  (in_RDI->invMat).d[0][1] = 0.0;
  (in_RDI->invMat).d[0][2] = 0.0;
  (in_RDI->invMat).d[0][3] = -dVar1;
  *(undefined4 *)(in_RDI->invMat).d[1] = 0;
  *(undefined4 *)((long)(in_RDI->invMat).d[1] + 4) = 0;
  *(undefined4 *)((in_RDI->invMat).d[1] + 1) = 0;
  *(undefined4 *)((long)(in_RDI->invMat).d[1] + 0xc) = 0x3ff00000;
  (in_RDI->invMat).d[1][2] = 0.0;
  (in_RDI->invMat).d[1][3] = -dVar2;
  (in_RDI->invMat).d[2][0] = 0.0;
  (in_RDI->invMat).d[2][1] = 0.0;
  (in_RDI->invMat).d[2][2] = 1.0;
  (in_RDI->invMat).d[2][3] = -dVar3;
  (in_RDI->invMat).d[3][2] = 0.0;
  (in_RDI->invMat).d[3][0] = 0.0;
  (in_RDI->invMat).d[3][1] = 0.0;
  (in_RDI->invMat).d[3][3] = 1.0;
  return in_RDI;
}

Assistant:

Transform Transform::translate(const Vector3f& v) {
    Mat4x4 m =  Mat4x4(1, 0, 0,  v.x,
                       0, 1, 0,  v.y,
                       0, 0, 1,  v.z,
                       0, 0, 0,    1);
    Mat4x4 mi = Mat4x4(1, 0, 0, -v.x,
                       0, 1, 0, -v.y,
                       0, 0, 1, -v.z,
                       0, 0, 0,    1);
    return Transform(m, mi);
}